

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimeGenerator.cpp
# Opt level: O0

size_t __thiscall primesieve::PrimeGenerator::getStopIdx(PrimeGenerator *this)

{
  ulong uVar1;
  uint64_t uVar2;
  byte *pbVar3;
  long in_RDI;
  size_t stopIdx;
  ulong local_10;
  
  uVar1 = *(ulong *)(in_RDI + 8);
  uVar2 = maxCachedPrime();
  if (uVar1 < uVar2) {
    pbVar3 = Array<unsigned_char,_720UL>::operator[]
                       ((Array<unsigned_char,_720UL> *)(anonymous_namespace)::primePi,
                        *(size_t *)(in_RDI + 8));
    local_10 = (ulong)*pbVar3;
  }
  else {
    local_10 = Array<unsigned_long,_128UL>::size
                         ((Array<unsigned_long,_128UL> *)(anonymous_namespace)::smallPrimes);
  }
  return local_10;
}

Assistant:

std::size_t PrimeGenerator::getStopIdx() const
{
  std::size_t stopIdx = 0;

  if (stop_ < maxCachedPrime())
    stopIdx = primePi[stop_];
  else
    stopIdx = smallPrimes.size();

  return stopIdx;
}